

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O0

void __thiscall Timidity::SF2Envelope::ApplyToAmp(SF2Envelope *this,Voice *v)

{
  BYTE BVar1;
  double local_30;
  double local_20;
  double amp;
  Voice *v_local;
  SF2Envelope *this_local;
  
  if ((this->super_MinEnvelope).stage == '\0') {
    v->left_mix = 0.0;
    v->right_mix = 0.0;
  }
  else {
    if (v->sample->type == '\x02') {
      local_30 = pow(10.0,(double)v->attenuation / -531.509);
    }
    else {
      local_30 = cb_to_amp((double)v->attenuation);
    }
    local_20 = local_30;
    BVar1 = (this->super_MinEnvelope).stage;
    if (BVar1 == '\x01') {
      local_20 = (double)this->volume * local_30;
    }
    else if (BVar1 != '\x02') {
      local_20 = cb_to_amp((double)this->volume);
      local_20 = local_20 * local_30;
    }
    v->left_mix = (float)(local_20 * 0.25 * (double)v->left_offset);
    v->right_mix = (float)(local_20 * 0.25 * (double)v->right_offset);
  }
  return;
}

Assistant:

void SF2Envelope::ApplyToAmp(Voice *v)
{
	double amp;

	if (stage == SF2_DELAY)
	{
		v->left_mix = 0;
		v->right_mix = 0;
		return;
	}

	amp = v->sample->type == INST_SF2 ? atten2amp(v->attenuation) : cb_to_amp(v->attenuation);

	switch (stage)
	{
	case SF2_ATTACK:
		amp *= volume;
		break;

	case SF2_HOLD:
		break;

	default:
		amp *= cb_to_amp(volume);
		break;
	}
	amp *= FINAL_MIX_SCALE * 0.5;
	v->left_mix = float(amp * v->left_offset);
	v->right_mix = float(amp * v->right_offset);
}